

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall
helics::FederateState::updateDataForExecEntry
          (FederateState *this,MessageProcessingResult result,IterationRequest iterate)

{
  pointer this_00;
  Time TVar1;
  char in_DL;
  char in_SIL;
  long in_RDI;
  FederateState *in_stack_00000088;
  Time in_stack_00000090;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  
  *(int *)(in_RDI + 0x300) = *(int *)(in_RDI + 0x300) + 1;
  if (in_SIL == '\0') {
    this_00 = std::
              unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
              operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                          *)0x5a47c4);
    TVar1 = TimeCoordinator::getGrantedTime(this_00);
    *(baseType *)(in_RDI + 0x508) = TVar1.internalTimeCode;
    std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
    operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_> *
               )0x5a47eb);
    TVar1 = TimeCoordinator::allowedSendTime
                      ((TimeCoordinator *)
                       CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    *(baseType *)(in_RDI + 0x510) = TVar1.internalTimeCode;
  }
  else if (in_SIL == '\x02') {
    *(undefined8 *)(in_RDI + 0x508) = 0xffffffffffffffff;
    *(undefined8 *)(in_RDI + 0x510) = 0xffffffffffffffff;
  }
  if (in_SIL != '\a') {
    if (in_DL == '\0') {
      if ((*(byte *)(in_RDI + 0x29c) & 1) == 0) {
        fillEventVectorUpTo(in_stack_00000088,in_stack_00000090);
      }
      else {
        fillEventVectorInclusive(in_stack_00000088,in_stack_00000090);
      }
    }
    else if (in_DL == '\x01') {
      fillEventVectorNextIteration(in_stack_00000088,in_stack_00000090);
    }
    else if (in_DL == '\x02') {
      if (in_SIL == '\0') {
        fillEventVectorUpTo(in_stack_00000088,in_stack_00000090);
      }
      else {
        fillEventVectorNextIteration(in_stack_00000088,in_stack_00000090);
      }
    }
  }
  return;
}

Assistant:

void FederateState::updateDataForExecEntry(MessageProcessingResult result, IterationRequest iterate)
{
    ++mGrantCount;
    if (result == MessageProcessingResult::NEXT_STEP) {
        time_granted = timeCoord->getGrantedTime();
        allowed_send_time = timeCoord->allowedSendTime();
    } else if (result == MessageProcessingResult::ITERATING) {
        time_granted = initializationTime;
        allowed_send_time = initializationTime;
    }
    if (result != MessageProcessingResult::ERROR_RESULT) {
        switch (iterate) {
            case IterationRequest::FORCE_ITERATION:
                fillEventVectorNextIteration(time_granted);
                break;
            case IterationRequest::ITERATE_IF_NEEDED:
                if (result == MessageProcessingResult::NEXT_STEP) {
                    fillEventVectorUpTo(time_granted);
                } else {
                    fillEventVectorNextIteration(time_granted);
                }
                break;
            case IterationRequest::NO_ITERATIONS:
                if (wait_for_current_time) {
                    fillEventVectorInclusive(time_granted);
                } else {
                    fillEventVectorUpTo(time_granted);
                }
                break;
            default:
                break;
        }
    }
}